

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void getChromaticities(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs)

{
  Chromaticities *pCVar1;
  invalid_argument *this;
  double dVar2;
  undefined8 local_98;
  undefined8 local_90 [4];
  SetAttr local_70;
  undefined8 local_40;
  undefined8 local_38;
  
  if (*i <= argc + -9) {
    pCVar1 = (Chromaticities *)operator_new(0x28);
    local_90[0] = 0x3ea8f5c33f23d70a;
    local_98 = 0x3f19999a3e99999a;
    local_38 = 0x3d75c28f3e19999a;
    local_40 = 0x3ea872b03ea01a37;
    Imf_3_4::Chromaticities::Chromaticities
              ((Chromaticities *)&local_70,(Vec2 *)local_90,(Vec2 *)&local_98,(Vec2 *)&local_38,
               (Vec2 *)&local_40);
    Imf_3_4::TypedAttribute<Imf_3_4::Chromaticities>::TypedAttribute(pCVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,attrName,(allocator<char> *)&local_98);
    std::__cxx11::string::string((string *)&local_70,(string *)local_90);
    local_70.part = part;
    local_70.attr = (Attribute *)pCVar1;
    std::vector<SetAttr,_std::allocator<SetAttr>_>::emplace_back<SetAttr>(attrs,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)local_90);
    dVar2 = strtod(argv[(long)*i + 1],(char **)0x0);
    *(float *)(pCVar1 + 8) = (float)dVar2;
    dVar2 = strtod(argv[(long)*i + 2],(char **)0x0);
    *(float *)(pCVar1 + 0xc) = (float)dVar2;
    dVar2 = strtod(argv[(long)*i + 3],(char **)0x0);
    *(float *)(pCVar1 + 0x10) = (float)dVar2;
    dVar2 = strtod(argv[(long)*i + 4],(char **)0x0);
    *(float *)(pCVar1 + 0x14) = (float)dVar2;
    dVar2 = strtod(argv[(long)*i + 5],(char **)0x0);
    *(float *)(pCVar1 + 0x18) = (float)dVar2;
    dVar2 = strtod(argv[(long)*i + 6],(char **)0x0);
    *(float *)(pCVar1 + 0x1c) = (float)dVar2;
    dVar2 = strtod(argv[(long)*i + 7],(char **)0x0);
    *(float *)(pCVar1 + 0x20) = (float)dVar2;
    dVar2 = strtod(argv[(long)*i + 8],(char **)0x0);
    *(float *)(pCVar1 + 0x24) = (float)dVar2;
    *i = *i + 9;
    return;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Expected 8 chromaticity values");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void
getChromaticities (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs)
{
    if (i > argc - 9) throw invalid_argument ("Expected 8 chromaticity values");

    ChromaticitiesAttribute* a =
        new ChromaticitiesAttribute (Chromaticities ());
    attrs.push_back (SetAttr (attrName, part, a));

    a->value ().red.x   = static_cast<float> (strtod (argv[i + 1], 0));
    a->value ().red.y   = static_cast<float> (strtod (argv[i + 2], 0));
    a->value ().green.x = static_cast<float> (strtod (argv[i + 3], 0));
    a->value ().green.y = static_cast<float> (strtod (argv[i + 4], 0));
    a->value ().blue.x  = static_cast<float> (strtod (argv[i + 5], 0));
    a->value ().blue.y  = static_cast<float> (strtod (argv[i + 6], 0));
    a->value ().white.x = static_cast<float> (strtod (argv[i + 7], 0));
    a->value ().white.y = static_cast<float> (strtod (argv[i + 8], 0));
    i += 9;
}